

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocalsocket_unix.cpp
# Opt level: O0

QString * __thiscall
QLocalSocketPrivate::generateErrorString
          (QLocalSocketPrivate *this,LocalSocketError error,QString *function)

{
  int *piVar1;
  QString *in_RCX;
  undefined4 in_EDX;
  QString *in_RDI;
  long in_FS_OFFSET;
  QString *errorString;
  QString *in_stack_fffffffffffffcd8;
  int in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffce4;
  int iVar2;
  QString *in_stack_fffffffffffffce8;
  undefined8 in_stack_fffffffffffffcf0;
  int fieldWidth;
  QString *in_stack_fffffffffffffcf8;
  QString *in_stack_fffffffffffffd00;
  undefined8 in_stack_fffffffffffffd28;
  QChar QVar3;
  QChar local_284;
  QChar local_282 [40];
  QChar local_232 [28];
  QChar local_1fa [28];
  QChar local_1c2 [28];
  QChar local_18a [28];
  QChar local_152 [28];
  QChar local_11a [28];
  QChar local_e2 [28];
  QChar local_aa [28];
  QChar local_72 [28];
  QChar local_3a [25];
  long local_8;
  
  QVar3.ucs = (char16_t)((ulong)in_stack_fffffffffffffd28 >> 0x30);
  fieldWidth = (int)((ulong)in_stack_fffffffffffffcf0 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).size = -0x5555555555555556;
  (in_RDI->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  QString::QString((QString *)0x386ffa);
  iVar2 = (int)((ulong)in_stack_fffffffffffffcd8 >> 0x20);
  switch(in_EDX) {
  case 0:
    QLocalSocket::tr((char *)in_stack_fffffffffffffce8,
                     (char *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),iVar2);
    QChar::QChar<char16_t,_true>(local_3a,L' ');
    QString::arg<QString,_true>
              (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,fieldWidth,QVar3);
    QString::operator=((QString *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                       in_stack_fffffffffffffcd8);
    QString::~QString((QString *)0x3870a9);
    QString::~QString((QString *)0x3870b6);
    break;
  case 1:
    QLocalSocket::tr((char *)in_stack_fffffffffffffce8,
                     (char *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),iVar2);
    QChar::QChar<char16_t,_true>(local_72,L' ');
    QString::arg<QString,_true>
              (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,fieldWidth,
               (QChar)(char16_t)((ulong)in_RCX >> 0x30));
    QString::operator=((QString *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                       in_stack_fffffffffffffcd8);
    QString::~QString((QString *)0x38713b);
    QString::~QString((QString *)0x387148);
    break;
  case 2:
    QLocalSocket::tr((char *)in_stack_fffffffffffffce8,
                     (char *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),iVar2);
    QChar::QChar<char16_t,_true>(local_aa,L' ');
    QString::arg<QString,_true>
              (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,fieldWidth,QVar3);
    QString::operator=((QString *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                       in_stack_fffffffffffffcd8);
    QString::~QString((QString *)0x3871cd);
    QString::~QString((QString *)0x3871da);
    break;
  case 3:
    QLocalSocket::tr((char *)in_stack_fffffffffffffce8,
                     (char *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),iVar2);
    QChar::QChar<char16_t,_true>(local_e2,L' ');
    QString::arg<QString,_true>
              (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,fieldWidth,QVar3);
    QString::operator=((QString *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                       in_stack_fffffffffffffcd8);
    QString::~QString((QString *)0x38725f);
    QString::~QString((QString *)0x38726c);
    break;
  case 4:
    QLocalSocket::tr((char *)in_stack_fffffffffffffce8,
                     (char *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),iVar2);
    QChar::QChar<char16_t,_true>(local_11a,L' ');
    QString::arg<QString,_true>
              (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,fieldWidth,QVar3);
    QString::operator=((QString *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                       in_stack_fffffffffffffcd8);
    QString::~QString((QString *)0x3872f1);
    QString::~QString((QString *)0x3872fe);
    break;
  case 5:
    QLocalSocket::tr((char *)in_stack_fffffffffffffce8,
                     (char *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),iVar2);
    QChar::QChar<char16_t,_true>(local_152,L' ');
    QString::arg<QString,_true>
              (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,fieldWidth,QVar3);
    QString::operator=((QString *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                       in_stack_fffffffffffffcd8);
    QString::~QString((QString *)0x387383);
    QString::~QString((QString *)0x387390);
    break;
  case 6:
    QLocalSocket::tr((char *)in_stack_fffffffffffffce8,
                     (char *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),iVar2);
    QChar::QChar<char16_t,_true>(local_18a,L' ');
    QString::arg<QString,_true>(in_RCX,in_stack_fffffffffffffcf8,fieldWidth,QVar3);
    QString::operator=((QString *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                       in_stack_fffffffffffffcd8);
    QString::~QString((QString *)0x387415);
    QString::~QString((QString *)0x387422);
    break;
  case 7:
    QLocalSocket::tr((char *)in_stack_fffffffffffffce8,
                     (char *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),iVar2);
    QChar::QChar<char16_t,_true>(local_1c2,L' ');
    QString::arg<QString,_true>(in_stack_fffffffffffffd00,in_RCX,fieldWidth,QVar3);
    QString::operator=((QString *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                       in_stack_fffffffffffffcd8);
    QString::~QString((QString *)0x3874a7);
    QString::~QString((QString *)0x3874b4);
    break;
  case 10:
    QLocalSocket::tr((char *)in_stack_fffffffffffffce8,
                     (char *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),iVar2);
    QChar::QChar<char16_t,_true>(local_1fa,L' ');
    QString::arg<QString,_true>
              (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,(int)((ulong)in_RCX >> 0x20),
               QVar3);
    QString::operator=((QString *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                       in_stack_fffffffffffffcd8);
    QString::~QString((QString *)0x387539);
    QString::~QString((QString *)0x387546);
    break;
  case 0x13:
    QLocalSocket::tr((char *)in_stack_fffffffffffffce8,
                     (char *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),iVar2);
    QChar::QChar<char16_t,_true>(local_232,L' ');
    QString::arg<QString,_true>
              (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,fieldWidth,QVar3);
    QString::operator=((QString *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                       in_stack_fffffffffffffcd8);
    QString::~QString((QString *)0x3875cb);
    QString::~QString((QString *)0x3875d8);
    break;
  case 0xffffffff:
  default:
    QLocalSocket::tr((char *)in_stack_fffffffffffffce8,
                     (char *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),iVar2);
    QChar::QChar<char16_t,_true>(local_282,L' ');
    QString::arg<QString,_true>
              (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,fieldWidth,QVar3);
    QVar3.ucs = (char16_t)((ulong)in_stack_fffffffffffffcf8 >> 0x30);
    piVar1 = __errno_location();
    iVar2 = *piVar1;
    QChar::QChar<char16_t,_true>(&local_284,L' ');
    QString::arg<int,_true>
              (in_stack_fffffffffffffce8,iVar2,in_stack_fffffffffffffce0,
               (int)((ulong)in_RCX >> 0x20),QVar3);
    QString::operator=((QString *)CONCAT44(iVar2,in_stack_fffffffffffffce0),in_RCX);
    QString::~QString((QString *)0x3876a4);
    QString::~QString((QString *)0x3876b1);
    QString::~QString((QString *)0x3876be);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QString QLocalSocketPrivate::generateErrorString(QLocalSocket::LocalSocketError error, const QString &function) const
{
    QString errorString;
    switch (error) {
    case QLocalSocket::ConnectionRefusedError:
        errorString = QLocalSocket::tr("%1: Connection refused").arg(function);
        break;
    case QLocalSocket::PeerClosedError:
        errorString = QLocalSocket::tr("%1: Remote closed").arg(function);
        break;
    case QLocalSocket::ServerNotFoundError:
        errorString = QLocalSocket::tr("%1: Invalid name").arg(function);
        break;
    case QLocalSocket::SocketAccessError:
        errorString = QLocalSocket::tr("%1: Socket access error").arg(function);
        break;
    case QLocalSocket::SocketResourceError:
        errorString = QLocalSocket::tr("%1: Socket resource error").arg(function);
        break;
    case QLocalSocket::SocketTimeoutError:
        errorString = QLocalSocket::tr("%1: Socket operation timed out").arg(function);
        break;
    case QLocalSocket::DatagramTooLargeError:
        errorString = QLocalSocket::tr("%1: Datagram too large").arg(function);
        break;
    case QLocalSocket::ConnectionError:
        errorString = QLocalSocket::tr("%1: Connection error").arg(function);
        break;
    case QLocalSocket::UnsupportedSocketOperationError:
        errorString = QLocalSocket::tr("%1: The socket operation is not supported").arg(function);
        break;
    case QLocalSocket::OperationError:
        errorString = QLocalSocket::tr("%1: Operation not permitted when socket is in this state").arg(function);
        break;
    case QLocalSocket::UnknownSocketError:
    default:
        errorString = QLocalSocket::tr("%1: Unknown error %2").arg(function).arg(errno);
    }
    return errorString;
}